

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitvector.hpp
# Opt level: O2

tuple<unsigned_long,_unsigned_long,_unsigned_long> * __thiscall
bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>::find_adjacent_children
          (tuple<unsigned_long,_unsigned_long,_unsigned_long> *__return_storage_ptr__,
          bt_impl<4096UL,_(bv::allocation_policy_t)0> *this,subtree_const_ref t,size_t child)

{
  size_t sVar1;
  size_t sVar2;
  ulong uVar3;
  size_t i;
  unsigned_long i_00;
  unsigned_long i_01;
  ulong i_02;
  unsigned_long uVar4;
  ulong uVar5;
  unsigned_long uVar6;
  bool is_leaf;
  anon_class_32_4_9a2c180c count;
  bool local_81;
  bt_impl<4096UL,_(bv::allocation_policy_t)0> *local_80;
  tuple<unsigned_long,_unsigned_long,_unsigned_long> *local_78;
  size_t local_70;
  ulong local_68;
  ulong local_60;
  subtree_ref_base<true> local_58;
  
  local_78 = __return_storage_ptr__;
  subtree_ref_base<true>::child(&local_58,(subtree_ref_base<true> *)&t,child);
  local_58._index = (size_t)&local_60;
  local_81 = local_58._height == 0;
  uVar3 = this->degree + 1;
  local_60 = 0x1000;
  if (local_58._height != 0) {
    local_60 = uVar3;
  }
  uVar6 = 0;
  uVar5 = this->buffer;
  i_01 = (child - uVar5) + 1;
  if (child < uVar5) {
    i_01 = uVar6;
  }
  i_00 = i_01;
  i_02 = uVar5 + i_01;
  local_80 = this;
  local_70 = child;
  local_58._vector = (bt_impl_t *)&t;
  local_58._height = (size_t)&local_81;
  local_58._size = (size_t)this;
  if (uVar3 < uVar5 + i_01) {
    i_02 = uVar3;
  }
  for (; uVar4 = i_01, uVar3 = uVar6, uVar5 = i_02, i_00 < i_02; i_00 = i_00 + 1) {
    sVar1 = find_adjacent_children::anon_class_32_4_9a2c180c::operator()
                      ((anon_class_32_4_9a2c180c *)&local_58,i_00);
    uVar6 = uVar6 + sVar1;
  }
  while ((i_01 < local_70 && (sVar1 = subtree_ref_base<true>::nchildren(&t), i_02 < sVar1))) {
    local_68 = uVar3;
    sVar1 = find_adjacent_children::anon_class_32_4_9a2c180c::operator()
                      ((anon_class_32_4_9a2c180c *)&local_58,i_01);
    uVar3 = local_68;
    sVar2 = find_adjacent_children::anon_class_32_4_9a2c180c::operator()
                      ((anon_class_32_4_9a2c180c *)&local_58,i_02);
    uVar6 = (uVar6 - sVar1) + sVar2;
    i_01 = i_01 + 1;
    i_02 = i_02 + 1;
    if (uVar3 < uVar6) {
      uVar4 = i_01;
      uVar3 = uVar6;
      uVar5 = i_02;
    }
  }
  (local_78->super__Tuple_impl<0UL,_unsigned_long,_unsigned_long,_unsigned_long>).
  super__Tuple_impl<1UL,_unsigned_long,_unsigned_long>.super__Tuple_impl<2UL,_unsigned_long>.
  super__Head_base<2UL,_unsigned_long,_false>._M_head_impl = local_80->buffer * local_60 - uVar3;
  (local_78->super__Tuple_impl<0UL,_unsigned_long,_unsigned_long,_unsigned_long>).
  super__Tuple_impl<1UL,_unsigned_long,_unsigned_long>.super__Head_base<1UL,_unsigned_long,_false>.
  _M_head_impl = uVar5;
  (local_78->super__Tuple_impl<0UL,_unsigned_long,_unsigned_long,_unsigned_long>).
  super__Head_base<0UL,_unsigned_long,_false>._M_head_impl = uVar4;
  return local_78;
}

Assistant:

std::tuple<size_t, size_t, size_t>
        bt_impl<W, AP>::find_adjacent_children(subtree_const_ref t,
                                               size_t child)
        {
            const bool is_leaf = t.child(child).is_leaf();
            const size_t max_count = is_leaf ? leaf_bits : (degree + 1);
            const auto count = [&](size_t i) {
                return t.pointers(i) == 0 ? max_count :
                       is_leaf            ? leaf_bits - t.child(i).size() :
                                            (degree + 1) - t.child(i).nchildren();
            };
            
            size_t begin = child >= buffer ? child - buffer + 1 : 0;
            size_t end = min(begin + buffer, degree + 1);
            
            size_t freeslots = 0;
            size_t maxfreeslots = 0;
            std::pair<size_t, size_t> window = { begin, end };
            
            // Sum for the initial window
            for(size_t i = begin; i < end; ++i)
                freeslots += count(i);
            maxfreeslots = freeslots;
            
            // Slide the window
            while(begin < child && end < t.nchildren())
            {
                freeslots = freeslots - count(begin) + count(end);
                
                begin += 1;
                end += 1;
                
                if(freeslots > maxfreeslots) {
                    window = { begin, end };
                    maxfreeslots = freeslots;
                }
            }
            
            // Reverse the count of free slots to get the total number of bits
            size_t total = max_count * buffer - maxfreeslots;
            
            assert(window.first <= child && child < window.second);
            return std::make_tuple( window.first, window.second, total );
        }